

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageBlock
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  int iVar2;
  ErrorMaker local_60;
  string_view local_50;
  string_view local_40;
  FileDescriptorProto *local_30;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *message_location_local;
  DescriptorProto *message_local;
  Parser *this_local;
  
  local_30 = containing_file;
  containing_file_local = (FileDescriptorProto *)message_location;
  message_location_local = (LocationRecorder *)message;
  message_local = (DescriptorProto *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"{");
  bVar1 = ConsumeEndOfDeclaration(this,local_40,(LocationRecorder *)containing_file_local);
  if (bVar1) {
    while( true ) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"}");
      bVar1 = TryConsumeEndOfDeclaration(this,local_50,(LocationRecorder *)0x0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      bVar1 = AtEnd(this);
      if (bVar1) {
        ErrorMaker::ErrorMaker
                  (&local_60,"Reached end of input in message definition (missing \'}\').");
        RecordError(this,local_60);
        return false;
      }
      bVar1 = ParseMessageStatement
                        (this,(DescriptorProto *)message_location_local,
                         (LocationRecorder *)containing_file_local,local_30);
      if (!bVar1) {
        SkipStatement(this);
      }
    }
    iVar2 = DescriptorProto::extension_range_size((DescriptorProto *)message_location_local);
    if (0 < iVar2) {
      anon_unknown_0::AdjustExtensionRangesWithMaxEndNumber
                ((DescriptorProto *)message_location_local);
    }
    iVar2 = DescriptorProto::reserved_range_size((DescriptorProto *)message_location_local);
    if (0 < iVar2) {
      anon_unknown_0::AdjustReservedRangesWithMaxEndNumber
                ((DescriptorProto *)message_location_local);
    }
    bVar1 = ValidateMessage(this,(DescriptorProto *)message_location_local);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseMessageBlock(DescriptorProto* message,
                               const LocationRecorder& message_location,
                               const FileDescriptorProto* containing_file) {
  DO(ConsumeEndOfDeclaration("{", &message_location));

  while (!TryConsumeEndOfDeclaration("}", nullptr)) {
    if (AtEnd()) {
      RecordError("Reached end of input in message definition (missing '}').");
      return false;
    }

    if (!ParseMessageStatement(message, message_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  }

  if (message->extension_range_size() > 0) {
    AdjustExtensionRangesWithMaxEndNumber(message);
  }
  if (message->reserved_range_size() > 0) {
    AdjustReservedRangesWithMaxEndNumber(message);
  }

  DO(ValidateMessage(message));

  return true;
}